

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::CopyFrom
          (RepeatedField<unsigned_long> *this,RepeatedField<unsigned_long> *other)

{
  if (other != this) {
    this->current_size_ = 0;
    if (other->current_size_ != 0) {
      Reserve(this,other->current_size_);
      this->current_size_ = this->current_size_ + other->current_size_;
      memcpy(this->arena_or_elements_,other->arena_or_elements_,(long)other->current_size_ << 3);
      return;
    }
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::CopyFrom(const RepeatedField& other) {
  if (&other == this) return;
  Clear();
  MergeFrom(other);
}